

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicBlock.cc
# Opt level: O0

void __thiscall flow::BasicBlock::unlinkSuccessor(BasicBlock *this,BasicBlock *successor)

{
  bool bVar1;
  vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *this_00;
  const_iterator local_78;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  local_70;
  BasicBlock **local_68;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  local_60;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  local_58;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  s;
  const_iterator local_48;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  local_40;
  BasicBlock *local_38;
  BasicBlock **local_30;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  local_28;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  local_20;
  __normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
  p;
  BasicBlock *successor_local;
  BasicBlock *this_local;
  
  p._M_current = (BasicBlock **)successor;
  if (successor == (BasicBlock *)0x0) {
    __assert_fail("successor != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xd9,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  local_28._M_current =
       (BasicBlock **)
       std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                 (&successor->predecessors_);
  local_30 = (BasicBlock **)
             std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                       ((vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)
                        (p._M_current + 0xd));
  local_38 = this;
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<flow::BasicBlock**,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>,flow::BasicBlock*>
                       (local_28,(__normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                                  )local_30,&local_38);
  local_40._M_current =
       (BasicBlock **)
       std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                 ((vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)
                  (p._M_current + 0xd));
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_40);
  if (!bVar1) {
    __assert_fail("p != successor->predecessors_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xdd,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  this_00 = (vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_> *)(p._M_current + 0xd);
  __gnu_cxx::
  __normal_iterator<flow::BasicBlock*const*,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>
  ::__normal_iterator<flow::BasicBlock**>
            ((__normal_iterator<flow::BasicBlock*const*,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>
              *)&local_48,&local_20);
  s._M_current = (BasicBlock **)
                 std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::erase
                           (this_00,local_48);
  local_60._M_current =
       (BasicBlock **)
       std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::begin
                 (&this->successors_);
  local_68 = (BasicBlock **)
             std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end
                       (&this->successors_);
  local_58 = std::
             find<__gnu_cxx::__normal_iterator<flow::BasicBlock**,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>,flow::BasicBlock*>
                       (local_60,(__normal_iterator<flow::BasicBlock_**,_std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>_>
                                  )local_68,(BasicBlock **)&p);
  local_70._M_current =
       (BasicBlock **)
       std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::end(&this->successors_)
  ;
  bVar1 = __gnu_cxx::operator!=(&local_58,&local_70);
  if (!bVar1) {
    __assert_fail("s != successors_.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/BasicBlock.cc"
                  ,0xe1,"void flow::BasicBlock::unlinkSuccessor(BasicBlock *)");
  }
  __gnu_cxx::
  __normal_iterator<flow::BasicBlock*const*,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>
  ::__normal_iterator<flow::BasicBlock**>
            ((__normal_iterator<flow::BasicBlock*const*,std::vector<flow::BasicBlock*,std::allocator<flow::BasicBlock*>>>
              *)&local_78,&local_58);
  std::vector<flow::BasicBlock_*,_std::allocator<flow::BasicBlock_*>_>::erase
            (&this->successors_,local_78);
  return;
}

Assistant:

void BasicBlock::unlinkSuccessor(BasicBlock* successor) {
  assert(successor != nullptr);

  auto p = std::find(successor->predecessors_.begin(),
                     successor->predecessors_.end(), this);
  assert(p != successor->predecessors_.end());
  successor->predecessors_.erase(p);

  auto s = std::find(successors_.begin(), successors_.end(), successor);
  assert(s != successors_.end());
  successors_.erase(s);
}